

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsscreen.cpp
# Opt level: O1

void __thiscall
QEglFSKmsScreen::QEglFSKmsScreen
          (QEglFSKmsScreen *this,QEglFSKmsDevice *device,QKmsOutput *output,bool headless)

{
  Data *pDVar1;
  Data *pDVar2;
  Data *pDVar3;
  drmModePropertyBlobPtr p_Var4;
  qreal qVar5;
  qreal qVar6;
  drmModePropertyPtr p_Var7;
  QKmsPlane *pQVar8;
  QSize QVar9;
  int iVar10;
  bool bVar11;
  undefined7 uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  undefined4 uVar16;
  undefined3 uVar17;
  bool bVar18;
  bool bVar19;
  undefined3 uVar20;
  QDebug this_00;
  Data *this_01;
  char cVar21;
  QEglFSKmsInterruptHandler *this_02;
  QLoggingCategory *pQVar22;
  char16_t *pcVar23;
  char16_t *pcVar24;
  char16_t *pcVar25;
  long in_FS_OFFSET;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QString local_100;
  QString local_e8;
  QString local_d0;
  QString local_b8;
  QDebug local_a0 [3];
  undefined8 local_88;
  undefined4 uStack_80;
  undefined8 uStack_7c;
  undefined4 local_74;
  char *local_70;
  QByteArray local_68;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QEglFSScreen::QEglFSScreen
            (&this->super_QEglFSScreen,
             *(void **)(QGuiApplicationPrivate::platform_integration + 0x30));
  *(undefined ***)this = &PTR__QEglFSKmsScreen_001262b0;
  this->m_device = device;
  pDVar1 = (output->name).d.d;
  (this->m_output).name.d.d = pDVar1;
  (this->m_output).name.d.ptr = (output->name).d.ptr;
  (this->m_output).name.d.size = (output->name).d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  (this->m_output).saved_crtc = output->saved_crtc;
  uVar13 = output->connector_id;
  uVar14 = output->crtc_index;
  uVar15 = output->crtc_id;
  uVar16 = *(undefined4 *)&output->field_0x24;
  qVar5 = (output->physical_size).wd;
  qVar6 = (output->physical_size).ht;
  iVar10 = output->mode;
  bVar11 = output->mode_set;
  uVar12 = *(undefined7 *)&output->field_0x41;
  (this->m_output).preferred_mode = output->preferred_mode;
  (this->m_output).mode = iVar10;
  (this->m_output).mode_set = bVar11;
  *(undefined7 *)&(this->m_output).field_0x41 = uVar12;
  (this->m_output).physical_size.wd = qVar5;
  (this->m_output).physical_size.ht = qVar6;
  (this->m_output).connector_id = uVar13;
  (this->m_output).crtc_index = uVar14;
  (this->m_output).crtc_id = uVar15;
  *(undefined4 *)&(this->m_output).field_0x24 = uVar16;
  pDVar2 = (output->modes).d.d;
  (this->m_output).modes.d.d = pDVar2;
  (this->m_output).modes.d.ptr = (output->modes).d.ptr;
  (this->m_output).modes.d.size = (output->modes).d.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  iVar10 = output->subpixel;
  uVar16 = *(undefined4 *)&output->field_0x6c;
  p_Var7 = output->dpms_prop;
  p_Var4 = output->edid_blob;
  bVar19 = output->wants_forced_plane;
  uVar20 = *(undefined3 *)&output->field_0x81;
  uVar15 = output->forced_plane_id;
  uVar13 = output->forced_plane_id;
  bVar11 = output->forced_plane_set;
  uVar17 = *(undefined3 *)&output->field_0x89;
  uVar14 = output->drm_format;
  bVar18 = output->drm_format_requested_by_user;
  *(undefined3 *)&(this->m_output).field_0x81 = *(undefined3 *)&output->field_0x81;
  (this->m_output).forced_plane_id = uVar13;
  (this->m_output).forced_plane_set = bVar11;
  *(undefined3 *)&(this->m_output).field_0x89 = uVar17;
  (this->m_output).drm_format = uVar14;
  (this->m_output).drm_format_requested_by_user = bVar18;
  (this->m_output).edid_blob = p_Var4;
  (this->m_output).wants_forced_plane = bVar19;
  *(undefined3 *)&(this->m_output).field_0x81 = uVar20;
  (this->m_output).forced_plane_id = uVar15;
  (this->m_output).subpixel = iVar10;
  *(undefined4 *)&(this->m_output).field_0x6c = uVar16;
  (this->m_output).dpms_prop = p_Var7;
  pDVar1 = (output->clone_source).d.d;
  (this->m_output).clone_source.d.d = pDVar1;
  (this->m_output).clone_source.d.ptr = (output->clone_source).d.ptr;
  (this->m_output).clone_source.d.size = (output->clone_source).d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pDVar3 = (output->available_planes).d.d;
  (this->m_output).available_planes.d.d = pDVar3;
  (this->m_output).available_planes.d.ptr = (output->available_planes).d.ptr;
  (this->m_output).available_planes.d.size = (output->available_planes).d.size;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pQVar8 = output->eglfs_plane;
  QVar9 = output->size;
  uVar13 = output->modeIdPropertyId;
  uVar14 = output->activePropertyId;
  uVar15 = output->mode_blob_id;
  (this->m_output).crtcIdPropertyId = output->crtcIdPropertyId;
  (this->m_output).modeIdPropertyId = uVar13;
  (this->m_output).activePropertyId = uVar14;
  (this->m_output).mode_blob_id = uVar15;
  (this->m_output).eglfs_plane = pQVar8;
  (this->m_output).size = QVar9;
  (this->m_edid).identifier.d.d = (Data *)0x0;
  (this->m_edid).identifier.d.ptr = (char16_t *)0x0;
  (this->m_edid).identifier.d.size = 0;
  (this->m_edid).manufacturer.d.d = (Data *)0x0;
  (this->m_edid).manufacturer.d.ptr = (char16_t *)0x0;
  (this->m_edid).manufacturer.d.size = 0;
  (this->m_edid).model.d.d = (Data *)0x0;
  (this->m_edid).model.d.ptr = (char16_t *)0x0;
  (this->m_edid).model.d.size = 0;
  (this->m_edid).serialNumber.d.d = (Data *)0x0;
  (this->m_edid).serialNumber.d.ptr = (char16_t *)0x0;
  (this->m_edid).serialNumber.d.size = 0;
  (this->m_edid).physicalSize.wd = -1.0;
  (this->m_edid).physicalSize.ht = -1.0;
  (this->m_edid).redChromaticity.xp = 0.0;
  (this->m_edid).redChromaticity.yp = 0.0;
  (this->m_edid).greenChromaticity.xp = 0.0;
  (this->m_edid).greenChromaticity.yp = 0.0;
  (this->m_edid).blueChromaticity.xp = 0.0;
  (this->m_edid).blueChromaticity.yp = 0.0;
  (this->m_edid).whiteChromaticity.xp = 0.0;
  (this->m_edid).whiteChromaticity.yp = 0.0;
  (this->m_edid).tables.d.d = (Data *)0x0;
  (this->m_edid).tables.d.ptr = (QList<unsigned_short> *)0x0;
  (this->m_edid).tables.d.size = 0;
  (this->m_pos).xp = 0;
  (this->m_pos).yp = 0;
  this->m_cursorOutOfRange = false;
  *(undefined8 *)((long)&(this->m_siblings).d.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->m_siblings).d.size + 4) = 0;
  (this->m_siblings).d.d = (Data *)0x0;
  (this->m_siblings).d.ptr = (QPlatformScreen **)0x0;
  this_02 = (QEglFSKmsInterruptHandler *)operator_new(0x20);
  QEglFSKmsInterruptHandler::QEglFSKmsInterruptHandler(this_02,this);
  this->m_interruptHandler = this_02;
  this->m_headless = headless;
  local_88 = this;
  QtPrivate::QPodArrayOps<QPlatformScreen*>::emplace<QPlatformScreen*&>
            ((QPodArrayOps<QPlatformScreen*> *)&this->m_siblings,(this->m_siblings).d.size,
             (QPlatformScreen **)&local_88);
  QList<QPlatformScreen_*>::end(&this->m_siblings);
  p_Var4 = (this->m_output).edid_blob;
  if (p_Var4 == (drmModePropertyBlobPtr)0x0) {
    pQVar22 = QtPrivateLogging::qLcEglfsKmsDebug();
    if (((pQVar22->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
      local_70 = pQVar22->name;
      local_88._0_4_ = 2;
      local_88._4_4_ = 0;
      uStack_80 = 0;
      uStack_7c = 0;
      local_74 = 0;
      QMessageLogger::debug();
      this_01 = local_68.d.d;
      QVar26.m_data = (storage_type *)0x17;
      QVar26.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar26);
      QTextStream::operator<<((QTextStream *)this_01,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((char)local_68.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
          '\x01') {
        QTextStream::operator<<((QTextStream *)local_68.d.d,' ');
      }
      (**(code **)(*(long *)this + 0x90))(&local_50,this);
      if (local_50.d.ptr == (char16_t *)0x0) {
        local_50.d.ptr = (char16_t *)&QString::_empty;
      }
      QDebug::putString((QChar *)&local_68,(ulong)local_50.d.ptr);
      if ((char)local_68.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
          '\x01') {
        QTextStream::operator<<((QTextStream *)local_68.d.d,' ');
      }
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      QDebug::~QDebug((QDebug *)&local_68);
    }
  }
  else {
    local_68.d.size = -0x5555555555555556;
    local_68.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_68.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    QByteArray::QByteArray(&local_68,(char *)p_Var4->data,(ulong)p_Var4->length);
    cVar21 = QEdidParser::parse((QByteArray *)&this->m_edid);
    pQVar22 = QtPrivateLogging::qLcEglfsKmsDebug();
    if (cVar21 == '\0') {
      if (((uint)pQVar22->field_2 & 1) != 0) {
        local_70 = pQVar22->name;
        local_88._0_4_ = 2;
        local_88._4_4_ = 0;
        uStack_80 = 0;
        uStack_7c = 0;
        local_74 = 0;
        QMessageLogger::debug();
        this_00.stream = local_a0[0].stream;
        QVar27.m_data = (storage_type *)0x24;
        QVar27.m_size = (qsizetype)&local_50;
        QString::fromUtf8(QVar27);
        QTextStream::operator<<((QTextStream *)this_00.stream,&local_50);
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((char)(((QArrayData *)(local_a0[0].stream + 0x30))->ref_)._q_value.
                  super___atomic_base<int>._M_i == '\x01') {
          QTextStream::operator<<((QTextStream *)local_a0[0].stream,' ');
        }
        (**(code **)(*(long *)this + 0x90))(&local_50,this);
        if (local_50.d.ptr == (char16_t *)0x0) {
          local_50.d.ptr = (char16_t *)&QString::_empty;
        }
        QDebug::putString((QChar *)local_a0,(ulong)local_50.d.ptr);
        if ((char)(((QArrayData *)(local_a0[0].stream + 0x30))->ref_)._q_value.
                  super___atomic_base<int>._M_i == '\x01') {
          QTextStream::operator<<((QTextStream *)local_a0[0].stream,' ');
        }
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
          }
        }
        QDebug::~QDebug(local_a0);
      }
    }
    else if (((uint)pQVar22->field_2 & 1) != 0) {
      local_70 = pQVar22->name;
      local_88._0_4_ = 2;
      local_88._4_4_ = 0;
      uStack_80 = 0;
      uStack_7c = 0;
      local_74 = 0;
      (**(code **)(*(long *)this + 0x90))(local_a0,this);
      QString::toLatin1_helper_inplace(&local_50);
      pcVar23 = local_50.d.ptr;
      if (local_50.d.ptr == (char16_t *)0x0) {
        pcVar23 = (char16_t *)&QByteArray::_empty;
      }
      QString::toLatin1_helper(&local_b8);
      pcVar25 = local_b8.d.ptr;
      if (local_b8.d.ptr == (char16_t *)0x0) {
        pcVar25 = (char16_t *)&QByteArray::_empty;
      }
      QString::toLatin1_helper(&local_d0);
      pcVar24 = local_d0.d.ptr;
      if (local_d0.d.ptr == (char16_t *)0x0) {
        pcVar24 = (char16_t *)&QByteArray::_empty;
      }
      QString::toLatin1_helper(&local_e8);
      if (local_e8.d.ptr == (char16_t *)0x0) {
        local_e8.d.ptr = (char16_t *)&QByteArray::_empty;
      }
      QString::toLatin1_helper(&local_100);
      if (local_100.d.ptr == (char16_t *)0x0) {
        local_100.d.ptr = (char16_t *)&QByteArray::_empty;
      }
      QMessageLogger::debug
                ((char *)&local_88,SUB84((this->m_edid).physicalSize.wd,0),
                 SUB84((this->m_edid).physicalSize.ht,0),
                 "EDID data for output \"%s\": identifier \'%s\', manufacturer \'%s\', model \'%s\', serial \'%s\', physical size: %.2fx%.2f"
                 ,pcVar23,pcVar25,pcVar24,local_e8.d.ptr,local_100.d.ptr);
      if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_100.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_d0.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
        }
      }
      local_88 = (QEglFSKmsScreen *)CONCAT44(local_88._4_4_,(undefined4)local_88);
      if ((QArrayData *)local_a0[0].stream != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_a0[0].stream = *(int *)local_a0[0].stream + -1;
        UNLOCK();
        local_88 = (QEglFSKmsScreen *)CONCAT44(local_88._4_4_,(undefined4)local_88);
        if (*(int *)local_a0[0].stream == 0) {
          QArrayData::deallocate((QArrayData *)local_a0[0].stream,2,0x10);
        }
      }
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QEglFSKmsScreen::QEglFSKmsScreen(QEglFSKmsDevice *device, const QKmsOutput &output, bool headless)
    : QEglFSScreen(static_cast<QEglFSIntegration *>(QGuiApplicationPrivate::platformIntegration())->display())
    , m_device(device)
    , m_output(output)
    , m_cursorOutOfRange(false)
    , m_powerState(PowerStateOn)
    , m_interruptHandler(new QEglFSKmsInterruptHandler(this))
    , m_headless(headless)
{
    m_siblings << this; // gets overridden later

    if (m_output.edid_blob) {
        QByteArray edid(reinterpret_cast<const char *>(m_output.edid_blob->data), m_output.edid_blob->length);
        if (m_edid.parse(edid))
            qCDebug(qLcEglfsKmsDebug, "EDID data for output \"%s\": identifier '%s', manufacturer '%s', model '%s', serial '%s', physical size: %.2fx%.2f",
                    name().toLatin1().constData(),
                    m_edid.identifier.toLatin1().constData(),
                    m_edid.manufacturer.toLatin1().constData(),
                    m_edid.model.toLatin1().constData(),
                    m_edid.serialNumber.toLatin1().constData(),
                    m_edid.physicalSize.width(), m_edid.physicalSize.height());
        else
            qCDebug(qLcEglfsKmsDebug) << "Failed to parse EDID data for output" << name(); // keep this debug, not warning
    } else {
        qCDebug(qLcEglfsKmsDebug) << "No EDID data for output" << name();
    }
}